

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall
wabt::AST::Set<(wabt::ExprType)25>(AST *this,VarExpr<(wabt::ExprType)25> *ve,bool local)

{
  string *__a;
  Var *pVVar1;
  Node *pNVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_bool>
  pVar3;
  byte local_89;
  Variable local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_60;
  _Base_ptr local_30;
  byte local_28;
  undefined1 local_19;
  VarExpr<(wabt::ExprType)25> *pVStack_18;
  bool local_local;
  VarExpr<(wabt::ExprType)25> *ve_local;
  AST *this_local;
  
  local_89 = 0;
  local_19 = local;
  pVStack_18 = ve;
  ve_local = (VarExpr<(wabt::ExprType)25> *)this;
  if (local) {
    __a = Var::name_abi_cxx11_(&ve->var);
    local_70.block_id = this->cur_block_id;
    local_70.defined = false;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_true>
              (&local_60,__a,&local_70);
    pVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
            ::insert(&this->vars_defined,&local_60);
    local_30 = (_Base_ptr)pVar3.first._M_node;
    local_89 = pVar3.second;
    local_28 = local_89;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
    ::~pair(&local_60);
  }
  if ((local_89 & 1) != 0) {
    if (this->value_stack_depth == 1) {
      pVVar1 = &pVStack_18->var;
      pNVar2 = InsertNode(this,DeclInit,Nop,(Expr *)0x0,1);
      (pNVar2->u).var = pVVar1;
      return;
    }
    PreDecl<(wabt::ExprType)25>(this,pVStack_18);
  }
  InsertNode(this,Expr,LocalTee,(Expr *)pVStack_18,1);
  return;
}

Assistant:

void Set(const VarExpr<T>& ve, bool local) {
    // Seen this var before?
    if (local &&
        vars_defined.insert({ ve.var.name(), { cur_block_id, false }}).second) {
      if (value_stack_depth == 1) {
        // Top level, declare it here.
        InsertNode(NodeType::DeclInit, ExprType::Nop, nullptr, 1).u.var =
            &ve.var;
        return;
      } else {
        // Inside exp, better leave it as assignment exp and lift the decl out.
        PreDecl(ve);
      }
    }
    InsertNode(NodeType::Expr, T, &ve, 1);
  }